

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::AggressiveDCEPass::IsTargetDead(AggressiveDCEPass *this,Instruction *inst)

{
  Instruction *def;
  bool bVar1;
  Op OVar2;
  DefUseManager *pDVar3;
  anon_class_8_1_898aa962 local_60;
  function<void_(spvtools::opt::Instruction_*)> local_58;
  bool local_31;
  Instruction *pIStack_30;
  bool dead;
  Instruction *tInst;
  Instruction *pIStack_20;
  uint32_t tId;
  Instruction *inst_local;
  AggressiveDCEPass *this_local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  tInst._4_4_ = opt::Instruction::GetSingleWordInOperand(inst,0);
  pDVar3 = Pass::get_def_use_mgr((Pass *)this);
  pIStack_30 = analysis::DefUseManager::GetDef(pDVar3,tInst._4_4_);
  OVar2 = opt::Instruction::opcode(pIStack_30);
  bVar1 = IsAnnotationInst(OVar2);
  if (bVar1) {
    OVar2 = opt::Instruction::opcode(pIStack_30);
    if (OVar2 != OpDecorationGroup) {
      __assert_fail("tInst->opcode() == spv::Op::OpDecorationGroup",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                    ,0xb7,"bool spvtools::opt::AggressiveDCEPass::IsTargetDead(Instruction *)");
    }
    local_31 = true;
    pDVar3 = Pass::get_def_use_mgr((Pass *)this);
    def = pIStack_30;
    local_60.dead = &local_31;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::AggressiveDCEPass::IsTargetDead(spvtools::opt::Instruction*)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_58,&local_60);
    analysis::DefUseManager::ForEachUser(pDVar3,def,&local_58);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_58);
  }
  else {
    bVar1 = IsLive(this,pIStack_30);
    local_31 = (bool)(bVar1 ^ 0xff);
  }
  this_local._7_1_ = (bool)(local_31 & 1);
  return this_local._7_1_;
}

Assistant:

bool AggressiveDCEPass::IsTargetDead(Instruction* inst) {
  const uint32_t tId = inst->GetSingleWordInOperand(0);
  Instruction* tInst = get_def_use_mgr()->GetDef(tId);
  if (IsAnnotationInst(tInst->opcode())) {
    // This must be a decoration group. We go through annotations in a specific
    // order. So if this is not used by any group or group member decorates, it
    // is dead.
    assert(tInst->opcode() == spv::Op::OpDecorationGroup);
    bool dead = true;
    get_def_use_mgr()->ForEachUser(tInst, [&dead](Instruction* user) {
      if (user->opcode() == spv::Op::OpGroupDecorate ||
          user->opcode() == spv::Op::OpGroupMemberDecorate)
        dead = false;
    });
    return dead;
  }
  return !IsLive(tInst);
}